

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char local_88 [8];
  char s [19];
  char local_68 [8];
  char sorted2 [19];
  char local_48 [8];
  char sorted1 [19];
  char local_28 [8];
  char presort [19];
  
  builtin_strncpy(local_28,"shreicny",8);
  builtin_strncpy(presort,"jqpvozxmbt",0xb);
  builtin_strncpy(local_48,"bcehijmn",8);
  builtin_strncpy(sorted1,"opqrstvxyz",0xb);
  builtin_strncpy(local_68,"bticjqny",8);
  builtin_strncpy(sorted2,"ozpvreshxm",0xb);
  strcpy(local_88,local_28);
  qsort(local_88,0x12,1,compare);
  iVar1 = strcmp(local_88,local_48);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xaa,"strcmp( s, sorted1 ) == 0");
  }
  strcpy(local_88,local_28);
  qsort(local_88,9,2,compare);
  iVar1 = strcmp(local_88,local_68);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xad,"strcmp( s, sorted2 ) == 0");
  }
  strcpy(local_88,local_28);
  qsort(local_88,1,1,compare);
  iVar1 = strcmp(local_88,local_28);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb0,"strcmp( s, presort ) == 0");
  }
  qsort(local_88,100,0,compare);
  iVar1 = strcmp(local_88,local_28);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/qsort.c, line %d - %s\n"
           ,0xb7,"strcmp( s, presort ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char presort[] = { "shreicnyjqpvozxmbt" };
    char sorted1[] = { "bcehijmnopqrstvxyz" };
    char sorted2[] = { "bticjqnyozpvreshxm" };
    char s[19];
    strcpy( s, presort );
    qsort( s, 18, 1, compare );
    TESTCASE( strcmp( s, sorted1 ) == 0 );
    strcpy( s, presort );
    qsort( s, 9, 2, compare );
    TESTCASE( strcmp( s, sorted2 ) == 0 );
    strcpy( s, presort );
    qsort( s, 1, 1, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#if defined( REGTEST ) && ( defined( __BSD_VISIBLE ) || defined( __APPLE__ ) )
    puts( "qsort.c: Skipping test #4 for BSD as it goes into endless loop here." );
#elif defined( REGTEST ) && defined( __ANDROID__ )
    puts( "qsort.c: Skipping test #4 for Android as it crashes." );
#else
    qsort( s, 100, 0, compare );
    TESTCASE( strcmp( s, presort ) == 0 );
#endif
    return TEST_RESULTS;
}